

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

InstMeshInfo *
rw::ps2::getInstMeshInfo(InstMeshInfo *__return_storage_ptr__,MatPipeline *pipe,Geometry *g,Mesh *m)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint32 uVar9;
  
  __return_storage_ptr__->numAttribs = 0;
  __return_storage_ptr__->numBrokenAttribs = 0;
  __return_storage_ptr__->vertexSize = 0;
  uVar3 = 0;
  lVar7 = 4;
  uVar9 = 0;
  uVar5 = 0;
  do {
    if (pipe->attribs[lVar7 + -4] != (PipeAttribute *)0x0) {
      uVar1 = pipe->attribs[lVar7 + -4]->attrib;
      if ((uVar1 & 6) == 0) {
        uVar9 = uVar9 + (((uVar1 >> 0x1a & 3) + 1) *
                         *(int *)(attribSize(unsigned_int)::size + (uVar1 >> 0x16 & 0xc)) >> 3);
        uVar5 = uVar5 + 1;
      }
      else {
        uVar3 = uVar3 + 1;
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  __return_storage_ptr__->numBrokenAttribs = uVar3;
  __return_storage_ptr__->vertexSize = uVar9;
  __return_storage_ptr__->numAttribs = uVar5;
  uVar1 = m->numIndices;
  if (g->meshHeader->flags == 1) {
    uVar3 = pipe->triStripCount;
    uVar8 = uVar3 - 2;
    uVar4 = (uVar1 - 2) / uVar8;
    uVar8 = (uVar1 - 2) % uVar8;
    __return_storage_ptr__->numBatches = uVar4;
    __return_storage_ptr__->batchVertCount = uVar3;
    __return_storage_ptr__->lastBatchVertCount = uVar8;
    if (uVar8 == 0) goto LAB_00126d41;
    __return_storage_ptr__->numBatches = uVar4 + 1;
    uVar8 = uVar8 + 2;
  }
  else {
    uVar8 = pipe->triListCount;
    __return_storage_ptr__->numBatches = ((uVar1 + uVar8) - 1) / uVar8;
    __return_storage_ptr__->batchVertCount = uVar8;
    uVar8 = uVar1 % uVar8;
  }
  __return_storage_ptr__->lastBatchVertCount = uVar8;
LAB_00126d41:
  if (__return_storage_ptr__->lastBatchVertCount == 0) {
    __return_storage_ptr__->lastBatchVertCount = __return_storage_ptr__->batchVertCount;
  }
  uVar3 = getBatchSize(pipe,__return_storage_ptr__->batchVertCount);
  __return_storage_ptr__->batchSize = uVar3;
  uVar5 = getBatchSize(pipe,__return_storage_ptr__->lastBatchVertCount);
  __return_storage_ptr__->lastBatchSize = uVar5;
  if (__return_storage_ptr__->numBrokenAttribs == 0) {
    iVar6 = uVar5 + (__return_storage_ptr__->numBatches - 1) * uVar3;
  }
  else {
    iVar6 = uVar5 + __return_storage_ptr__->numBrokenAttribs * __return_storage_ptr__->numBatches *
                    2 + (__return_storage_ptr__->numBatches - 1) * (uVar3 + 1);
  }
  __return_storage_ptr__->size = iVar6 + 1U;
  __return_storage_ptr__->size2 = 0;
  lVar7 = 0;
  uVar3 = 0;
  do {
    if ((pipe->attribs[lVar7] != (PipeAttribute *)0x0) &&
       (uVar1 = pipe->attribs[lVar7]->attrib, (uVar1 & 6) != 0)) {
      iVar2 = *(int *)(attribSize(unsigned_int)::size + (uVar1 >> 0x16 & 0xc));
      __return_storage_ptr__->attribPos[lVar7] = iVar6 + 1U + uVar3;
      uVar3 = ((((uVar1 >> 0x1a & 3) + 1) * iVar2 >> 3) * m->numIndices + 0xf >> 4) + uVar3;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  __return_storage_ptr__->size2 = uVar3;
  return __return_storage_ptr__;
}

Assistant:

InstMeshInfo
getInstMeshInfo(MatPipeline *pipe, Geometry *g, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im;
	im.numAttribs = 0;
	im.numBrokenAttribs = 0;
	im.vertexSize = 0;
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])) {
			if(a->attrib & AT_RW)
				im.numBrokenAttribs++;
			else{
				im.vertexSize += attribSize(a->attrib);
				im.numAttribs++;
			}
		}
	if(g->meshHeader->flags == MeshHeader::TRISTRIP){
		im.numBatches = (m->numIndices-2) / (pipe->triStripCount-2);
		im.batchVertCount = pipe->triStripCount;
		im.lastBatchVertCount = (m->numIndices-2) % (pipe->triStripCount-2);
		if(im.lastBatchVertCount){
			im.numBatches++;
			im.lastBatchVertCount += 2;
		}
	}else{	// TRILIST; nothing else supported yet
		im.numBatches = (m->numIndices+pipe->triListCount-1) /
		                 pipe->triListCount;
		im.batchVertCount = pipe->triListCount;
		im.lastBatchVertCount = m->numIndices % pipe->triListCount;
	}
	if(im.lastBatchVertCount == 0)
		im.lastBatchVertCount = im.batchVertCount;

	im.batchSize = getBatchSize(pipe, im.batchVertCount);
	im.lastBatchSize = getBatchSize(pipe, im.lastBatchVertCount);
	if(im.numBrokenAttribs == 0)
		im.size = 1 + im.batchSize*(im.numBatches-1) + im.lastBatchSize;
	else
		im.size = 2*im.numBrokenAttribs*im.numBatches +
		          (1+im.batchSize)*(im.numBatches-1) + 1+im.lastBatchSize;

	/* figure out size and addresses of broken out sections */
	im.size2 = 0;
	for(uint i = 0; i < nelem(im.attribPos); i++)
		if((a = pipe->attribs[i]) && a->attrib & AT_RW){
			im.attribPos[i] = im.size2 + im.size;
			im.size2 += QWC(m->numIndices*attribSize(a->attrib));
		}

	return im;
}